

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O0

LY_ERR yin_parse_leaflist(lysp_yin_ctx *ctx,tree_node_meta *node_meta)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  lysp_node *plVar4;
  lysp_node *parent;
  ly_ctx *local_1b0;
  ly_ctx *local_1a8;
  LY_ERR ret___3;
  LY_ERR ret___2;
  yin_subelement subelems [14];
  LY_ERR ret___1;
  LY_ERR ret__;
  char **iter__;
  size_t offset__;
  char *p__;
  lysp_node_leaflist *llist;
  tree_node_meta *node_meta_local;
  lysp_yin_ctx *ctx_local;
  
  parent = (lysp_node *)calloc(1,0xd0);
  if (parent == (lysp_node *)0x0) {
    ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yin_parse_leaflist"
          );
    ctx_local._4_4_ = LY_EMEM;
  }
  else {
    if (*node_meta->nodes == (lysp_node *)0x0) {
      *node_meta->nodes = parent;
    }
    else {
      plVar4 = *node_meta->nodes;
      while (_ret___1 = (long *)((long)plVar4 +
                                (long)*node_meta->nodes + (0x10 - (long)*node_meta->nodes)),
            *_ret___1 != 0) {
        plVar4 = (lysp_node *)*_ret___1;
      }
      *_ret___1 = (long)parent;
    }
    parent->nodetype = 8;
    parent->parent = node_meta->parent;
    subelems[0xd]._20_4_ = lyxml_ctx_next(ctx->xmlctx);
    ctx_local._4_4_ = subelems[0xd]._20_4_;
    if ((subelems[0xd]._20_4_ == LY_SUCCESS) &&
       (subelems[0xd]._16_4_ =
             yin_parse_attribute(ctx,YIN_ARG_NAME,&parent->name,Y_IDENTIF_ARG,LY_STMT_LEAF_LIST),
       ctx_local._4_4_ = subelems[0xd]._16_4_, subelems[0xd]._16_4_ == LY_SUCCESS)) {
      ret___3 = 0x50000;
      subelems[0]._0_8_ = &parent->flags;
      subelems[0].dest._0_2_ = 2;
      subelems[0].flags = 0;
      subelems[0]._18_2_ = 7;
      subelems[1]._0_8_ = parent + 3;
      subelems[1].dest._0_2_ = 0;
      subelems[1].flags = 0;
      subelems[1]._18_2_ = 8;
      subelems[2]._0_8_ = &parent->dsc;
      subelems[2].dest._0_2_ = 2;
      subelems[2].flags = 0;
      subelems[2]._18_2_ = 0x13;
      subelems[3]._0_8_ = &parent->iffeatures;
      subelems[3].dest._0_2_ = 0;
      subelems[3].flags = 0;
      subelems[3]._18_2_ = 0x19;
      subelems[4].dest._0_2_ = 2;
      subelems[4].flags = 0;
      subelems[4]._18_2_ = 0x1a;
      subelems[5].dest._0_2_ = 2;
      subelems[5].flags = 0;
      subelems[5]._18_2_ = 0x1d;
      subelems[6]._0_8_ = parent + 1;
      subelems[6].dest._0_2_ = 0;
      subelems[6].flags = 0;
      subelems[6]._18_2_ = 0x1f;
      subelems[7]._0_8_ = &parent->flags;
      subelems[7].dest._0_2_ = 2;
      subelems[7].flags = 0;
      subelems[7]._18_2_ = 0x27;
      subelems[8]._0_8_ = &parent->ref;
      subelems[8].dest._0_2_ = 2;
      subelems[8].flags = 0;
      subelems[8]._18_2_ = 0x2c;
      subelems[9]._0_8_ = &parent->flags;
      subelems[9].dest._0_2_ = 2;
      subelems[9].flags = 0;
      subelems[9]._18_2_ = 0x2e;
      subelems[10]._0_8_ = &parent[1].next;
      subelems[10].dest._0_2_ = 3;
      subelems[10].flags = 0;
      subelems[10]._18_2_ = 0x31;
      subelems[0xb]._0_8_ = &parent[2].exts;
      subelems[0xb].dest._0_2_ = 2;
      subelems[0xb].flags = 0;
      subelems[0xb]._18_2_ = 0x33;
      subelems[0xc]._0_8_ = &parent[1].nodetype;
      subelems[0xc].dest._0_2_ = 2;
      subelems[4]._0_8_ = parent;
      subelems[5]._0_8_ = parent;
      memset(&subelems[0xc].flags,0,0x18);
      subelems[0xc].flags = 0;
      subelems[0xc]._18_2_ = 0xf;
      ctx_local._4_4_ =
           yin_parse_content(ctx,(yin_subelement *)&ret___3,0xe,parent,LY_STMT_LEAF_LIST,
                             (char **)0x0,&parent->exts);
      if ((ctx_local._4_4_ == LY_SUCCESS) &&
         (ctx_local._4_4_ = yin_unres_exts_add(ctx,parent->exts), ctx_local._4_4_ == LY_SUCCESS)) {
        iVar1._0_2_ = parent[3].nodetype;
        iVar1._2_2_ = parent[3].flags;
        if ((iVar1 == 0) || (parent[3].parent == (lysp_node *)0x0)) {
          if ((*(int *)&parent[3].field_0xc == 0) ||
             (uVar2._0_2_ = parent[3].nodetype, uVar2._2_2_ = parent[3].flags,
             uVar2 <= *(uint *)&parent[3].field_0xc)) {
            ctx_local._4_4_ = LY_SUCCESS;
          }
          else {
            if (ctx == (lysp_yin_ctx *)0x0) {
              local_1b0 = (ly_ctx *)0x0;
            }
            else {
              local_1b0 = (ly_ctx *)
                          **(undefined8 **)
                            (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            uVar3._0_2_ = parent[3].nodetype;
            uVar3._2_2_ = parent[3].flags;
            ly_vlog(local_1b0,(char *)0x0,LYVE_SEMANTICS,
                    "Invalid combination of min-elements and max-elements: min value %u is bigger than the max value %u."
                    ,(ulong)uVar3,(ulong)*(uint *)&parent[3].field_0xc);
            ctx_local._4_4_ = LY_EVALID;
          }
        }
        else {
          if (ctx == (lysp_yin_ctx *)0x0) {
            local_1a8 = (ly_ctx *)0x0;
          }
          else {
            local_1a8 = (ly_ctx *)
                        **(undefined8 **)
                          (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          ly_vlog(local_1a8,(char *)0x0,LYVE_SYNTAX_YIN,
                  "Invalid combination of sub-elemnts \"%s\" and \"%s\" in \"%s\" element.",
                  "min-elements","default","leaf-list");
          ctx_local._4_4_ = LY_EVALID;
        }
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
yin_parse_leaflist(struct lysp_yin_ctx *ctx, struct tree_node_meta *node_meta)
{
    struct lysp_node_leaflist *llist;

    LY_LIST_NEW_RET(ctx->xmlctx->ctx, node_meta->nodes, llist, next, LY_EMEM);

    llist->nodetype = LYS_LEAFLIST;
    llist->parent = node_meta->parent;

    /* parse argument */
    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_NAME, &llist->name, Y_IDENTIF_ARG, LY_STMT_LEAF_LIST));

    /* parse content */
    struct yin_subelement subelems[] = {
        {LY_STMT_CONFIG, &llist->flags, YIN_SUBELEM_UNIQUE},
        {LY_STMT_DEFAULT, &llist->dflts, 0},
        {LY_STMT_DESCRIPTION, &llist->dsc, YIN_SUBELEM_UNIQUE},
        {LY_STMT_IF_FEATURE, &llist->iffeatures, 0},
        {LY_STMT_MAX_ELEMENTS, llist, YIN_SUBELEM_UNIQUE},
        {LY_STMT_MIN_ELEMENTS, llist, YIN_SUBELEM_UNIQUE},
        {LY_STMT_MUST, &llist->musts, 0},
        {LY_STMT_ORDERED_BY, &llist->flags, YIN_SUBELEM_UNIQUE},
        {LY_STMT_REFERENCE, &llist->ref, YIN_SUBELEM_UNIQUE},
        {LY_STMT_STATUS, &llist->flags, YIN_SUBELEM_UNIQUE},
        {LY_STMT_TYPE, &llist->type, YIN_SUBELEM_UNIQUE | YIN_SUBELEM_MANDATORY},
        {LY_STMT_UNITS, &llist->units, YIN_SUBELEM_UNIQUE},
        {LY_STMT_WHEN, &llist->when, YIN_SUBELEM_UNIQUE},
        {LY_STMT_EXTENSION_INSTANCE, NULL, 0},
    };

    LY_CHECK_RET(yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), llist, LY_STMT_LEAF_LIST, NULL, &llist->exts));

    /* store extension instance array (no realloc anymore) to find the plugin records and finish parsing */
    LY_CHECK_RET(yin_unres_exts_add(ctx, llist->exts));

    /* check invalid combination of subelements */
    if ((llist->min) && (llist->dflts)) {
        LOGVAL_PARSER((struct lysp_ctx *)ctx, LY_VCODE_INCHILDSTMSCOMB_YIN, "min-elements", "default", "leaf-list");
        return LY_EVALID;
    }
    if (llist->max && (llist->min > llist->max)) {
        LOGVAL_PARSER((struct lysp_ctx *)ctx, LY_VCODE_INVAL_MINMAX, llist->min, llist->max);
        return LY_EVALID;
    }

    return LY_SUCCESS;
}